

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall SimpleLoggerMgr::removeThread(SimpleLoggerMgr *this,uint64_t tid)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  uint64_t local_20;
  
  local_30._M_device = &this->activeThreadsLock;
  local_30._M_owns = false;
  local_20 = tid;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->activeThreads)._M_h,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void SimpleLoggerMgr::removeThread(uint64_t tid) {
    std::unique_lock<std::mutex> l(activeThreadsLock);
    activeThreads.erase(tid);
}